

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exponentiation.cc
# Opt level: O3

int BN_mod_exp2_mont(BIGNUM *r,BIGNUM *a1,BIGNUM *p1,BIGNUM *a2,BIGNUM *p2,BIGNUM *m,BN_CTX *ctx,
                    BN_MONT_CTX *m_ctx)

{
  int iVar1;
  BIGNUM *r_00;
  uint uVar2;
  BN_MONT_CTX *mont;
  
  uVar2 = 0;
  if (m_ctx == (BN_MONT_CTX *)0x0) {
    m_ctx = (BN_MONT_CTX *)BN_MONT_CTX_new_for_modulus((BIGNUM *)m,(BN_CTX *)ctx);
    mont = m_ctx;
    if (m_ctx == (BN_MONT_CTX *)0x0) {
      return 0;
    }
  }
  else {
    mont = (BN_MONT_CTX *)0x0;
  }
  r_00 = BN_new();
  if (r_00 != (BIGNUM *)0x0) {
    iVar1 = BN_mod_exp_mont(r,a1,p1,m,ctx,m_ctx);
    uVar2 = 0;
    if (((iVar1 != 0) && (iVar1 = BN_mod_exp_mont(r_00,a2,p2,m,ctx,m_ctx), iVar1 != 0)) &&
       (iVar1 = BN_to_montgomery((BIGNUM *)r,(BIGNUM *)r,(BN_MONT_CTX *)m_ctx,(BN_CTX *)ctx),
       iVar1 != 0)) {
      iVar1 = BN_mod_mul_montgomery(r,r,r_00,m_ctx,ctx);
      uVar2 = (uint)(iVar1 != 0);
    }
    BN_free(r_00);
  }
  if (mont != (BN_MONT_CTX *)0x0) {
    BN_MONT_CTX_free(mont);
  }
  return uVar2;
}

Assistant:

int BN_mod_exp2_mont(BIGNUM *rr, const BIGNUM *a1, const BIGNUM *p1,
                     const BIGNUM *a2, const BIGNUM *p2, const BIGNUM *m,
                     BN_CTX *ctx, const BN_MONT_CTX *mont) {
  // Allocate a montgomery context if it was not supplied by the caller.
  bssl::UniquePtr<BN_MONT_CTX> new_mont;
  if (mont == nullptr) {
    new_mont.reset(BN_MONT_CTX_new_for_modulus(m, ctx));
    if (new_mont == nullptr) {
      return 0;
    }
    mont = new_mont.get();
  }

  // BN_mod_mul_montgomery removes one Montgomery factor, so passing one
  // Montgomery-encoded and one non-Montgomery-encoded value gives a
  // non-Montgomery-encoded result.
  bssl::UniquePtr<BIGNUM> tmp(BN_new());
  if (tmp == nullptr ||  //
      !BN_mod_exp_mont(rr, a1, p1, m, ctx, mont) ||
      !BN_mod_exp_mont(tmp.get(), a2, p2, m, ctx, mont) ||
      !BN_to_montgomery(rr, rr, mont, ctx) ||
      !BN_mod_mul_montgomery(rr, rr, tmp.get(), mont, ctx)) {
    return 0;
  }

  return 1;
}